

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,basic_string_view<char> value)

{
  format_specs *spec;
  ulong uVar1;
  ulong uVar2;
  ulong size;
  char *data;
  str_writer<char> f;
  error_handler local_19;
  
  uVar2 = value.size_;
  spec = this->specs_;
  if ((spec->type_ != '\0') && (spec->type_ != 's')) {
    error_handler::on_error(&local_19,"invalid type specifier");
  }
  uVar1 = (ulong)spec->precision_;
  size = uVar2;
  if (uVar1 < uVar2) {
    size = uVar1;
  }
  if ((long)uVar1 < 0) {
    size = uVar2;
  }
  f.size = size;
  f.s = value.data_;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::str_writer<char>>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)this
             ,size,&spec->super_align_spec,f);
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    internal::check_string_type_spec(specs_.type_, internal::error_handler());
    writer_.write_str(value, specs_);
    return out();
  }